

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkRect2D * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRect2D>
          (Impl *this,VkRect2D *src,size_t count,ScratchAllocator *alloc)

{
  VkRect2D *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkRect2D>(alloc,count);
    if (pVVar1 != (VkRect2D *)0x0) {
      pVVar1 = (VkRect2D *)memmove(pVVar1,src,count << 4);
      return pVVar1;
    }
  }
  return (VkRect2D *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}